

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O1

int arg_match_helper(arg *arg_,arg_def *def,char **argv,char *err_msg)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  char *__s1;
  
  if (err_msg != (char *)0x0) {
    *err_msg = '\0';
  }
  pcVar3 = *argv;
  if (pcVar3 == (char *)0x0) {
    return 0;
  }
  if (*pcVar3 != '-') {
    return 0;
  }
  if (def->short_name == (char *)0x0) {
LAB_0011eb52:
    pcVar2 = def->long_name;
    if (pcVar2 == (char *)0x0) {
LAB_0011ebd7:
      uVar4 = 1;
      __s1 = (char *)0x0;
      pcVar2 = (char *)0x0;
    }
    else {
      __n = strlen(pcVar2);
      if (pcVar3[1] == '-') {
        __s1 = pcVar3 + 2;
        iVar1 = strncmp(__s1,pcVar2,__n);
        if (iVar1 == 0) {
          uVar4 = 1;
          if ((pcVar3[__n + 2] == '=') || (pcVar3[__n + 2] == '\0')) {
            pcVar2 = (char *)0x0;
            if (__s1[__n] == '=') {
              pcVar2 = pcVar3 + __n + 3;
            }
            goto LAB_0011ebe5;
          }
          goto LAB_0011ebd7;
        }
      }
      __s1 = (char *)0x0;
      uVar4 = 1;
      pcVar2 = (char *)0x0;
    }
  }
  else {
    __s1 = pcVar3 + 1;
    iVar1 = strcmp(__s1,def->short_name);
    if (iVar1 != 0) goto LAB_0011eb52;
    if (def->has_val == 0) {
      uVar4 = 1;
      pcVar2 = (char *)0x0;
    }
    else {
      uVar4 = 2;
      pcVar2 = argv[1];
    }
  }
LAB_0011ebe5:
  if (__s1 == (char *)0x0) {
    return 0;
  }
  iVar1 = def->has_val;
  if (iVar1 == -1) {
LAB_0011ec21:
    arg_->argv = argv;
    arg_->name = __s1;
    arg_->val = pcVar2;
    arg_->argv_step = uVar4;
    arg_->def = def;
    iVar1 = 1;
  }
  else {
    if (iVar1 == 0 || pcVar2 != (char *)0x0) {
      if (pcVar2 == (char *)0x0 || iVar1 != 0) goto LAB_0011ec21;
      if (err_msg == (char *)0x0) {
        return 0;
      }
      pcVar3 = "Error: option %s requires no argument.\n";
    }
    else {
      if (err_msg == (char *)0x0) {
        return 0;
      }
      pcVar3 = "Error: option %s requires argument.\n";
    }
    iVar1 = 0;
    snprintf(err_msg,200,pcVar3,__s1);
  }
  return iVar1;
}

Assistant:

int arg_match_helper(struct arg *arg_, const struct arg_def *def, char **argv,
                     char *err_msg) {
  struct arg arg;

  if (err_msg) err_msg[0] = '\0';

  assert(def->has_val == 0 || def->has_val == 1 || def->has_val == -1);

  if (!argv[0] || argv[0][0] != '-') return 0;

  arg = arg_init(argv);

  if (def->short_name && !strcmp(arg.argv[0] + 1, def->short_name)) {
    arg.name = arg.argv[0] + 1;
    arg.val = def->has_val ? arg.argv[1] : NULL;
    arg.argv_step = def->has_val ? 2 : 1;
  } else if (def->long_name) {
    const size_t name_len = strlen(def->long_name);

    if (arg.argv[0][1] == '-' &&
        !strncmp(arg.argv[0] + 2, def->long_name, name_len) &&
        (arg.argv[0][name_len + 2] == '=' ||
         arg.argv[0][name_len + 2] == '\0')) {
      arg.name = arg.argv[0] + 2;
      arg.val = arg.name[name_len] == '=' ? arg.name + name_len + 1 : NULL;
      arg.argv_step = 1;
    }
  }

  if (arg.name) {
    if (def->has_val == -1) {
      arg.def = def;
      *arg_ = arg;
      return 1;
    }

    if (!arg.val && def->has_val) {
      SET_ERR_STRING("Error: option %s requires argument.\n", arg.name);
      return 0;
    }

    if (arg.val && !def->has_val) {
      SET_ERR_STRING("Error: option %s requires no argument.\n", arg.name);
      return 0;
    }

    arg.def = def;
    *arg_ = arg;
    return 1;
  }

  return 0;
}